

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

group * __thiscall
clipp::in_sequence<clipp::parameter,clipp::parameter>
          (group *__return_storage_ptr__,clipp *this,parameter *param,parameter *params)

{
  group gStack_268;
  parameter local_220;
  parameter local_120;
  
  this[0x21] = (clipp)0x1;
  (param->super_token<clipp::parameter>).blocking_ = true;
  parameter::parameter(&local_120,(parameter *)this);
  parameter::parameter(&local_220,param);
  group::group<clipp::parameter>(&gStack_268,&local_120,&local_220);
  gStack_268.scoped_ = true;
  group::group(__return_storage_ptr__,&gStack_268);
  group::~group(&gStack_268);
  parameter::~parameter(&local_220);
  parameter::~parameter(&local_120);
  return __return_storage_ptr__;
}

Assistant:

inline group
in_sequence(Param param, Params... params)
{
    detail::set_blocking(true, param, params...);
    return group{std::move(param), std::move(params)...}.scoped(true);
}